

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::
FunctionMockerBase<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
DescribeDefaultActionTo
          (FunctionMockerBase<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>
           *this,ArgumentTuple *args,ostream *os)

{
  OnCallSpec<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)> *pOVar1;
  ostream *poVar2;
  int in_ECX;
  string local_30;
  
  pOVar1 = FindOnCallSpec(this,args);
  if (pOVar1 != (OnCallSpec<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>
                 *)0x0) {
    poVar2 = std::operator<<(os,"taking default action specified at:\n");
    FormatFileLocation_abi_cxx11_
              (&local_30,*(internal **)pOVar1,(char *)(ulong)*(uint *)(pOVar1 + 8),in_ECX);
    poVar2 = std::operator<<(poVar2,(string *)&local_30);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_30);
    return;
  }
  std::operator<<(os,"returning default value.\n");
  return;
}

Assistant:

void DescribeDefaultActionTo(const ArgumentTuple& args,
                               ::std::ostream* os) const {
    const OnCallSpec<F>* const spec = FindOnCallSpec(args);

    if (spec == NULL) {
      *os << (internal::type_equals<Result, void>::value ?
              "returning directly.\n" :
              "returning default value.\n");
    } else {
      *os << "taking default action specified at:\n"
          << FormatFileLocation(spec->file(), spec->line()) << "\n";
    }
  }